

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O3

void Cbs_ManDeriveReason(Cbs_Man_t *p,int Level)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  void **ppvVar7;
  Gia_Obj_t **ppGVar8;
  Vec_Ptr_t *pVVar9;
  size_t sVar10;
  Gia_Obj_t *pGVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong local_48;
  
  lVar13 = (long)(p->pClauses).iHead;
  if ((p->pClauses).pData[lVar13] != (Gia_Obj_t *)0x0) {
    __assert_fail("pQue->pData[pQue->iHead] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x25f,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  uVar14 = lVar13 + 1;
  if ((p->pClauses).iTail <= (int)uVar14) {
    __assert_fail("pQue->iHead + 1 < pQue->iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x260,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
  }
  p->vTemp->nSize = 0;
  local_48 = uVar14 & 0xffffffff;
  do {
    pGVar11 = (p->pClauses).pData[uVar14];
    if (((uint)*(ulong *)pGVar11 >> 0x1e & 1) != 0) {
      *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xffffffffbfffffff;
      pVVar9 = p->vTemp;
      uVar6 = pVVar9->nSize;
      if (uVar6 == pVVar9->nCap) {
        if ((int)uVar6 < 0x10) {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar9->pArray,0x80);
          }
          pVVar9->pArray = ppvVar7;
          pVVar9->nCap = 0x10;
        }
        else {
          if (pVVar9->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar9->pArray,(ulong)uVar6 << 4);
          }
          pVVar9->pArray = ppvVar7;
          pVVar9->nCap = uVar6 * 2;
        }
      }
      else {
        ppvVar7 = pVVar9->pArray;
      }
      iVar12 = pVVar9->nSize;
      pVVar9->nSize = iVar12 + 1;
      ppvVar7[iVar12] = pGVar11;
      uVar6 = pGVar11->Value;
      if (uVar6 == 0xffffffff) {
        __assert_fail("pVar->Value != ~0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                      ,99,"int Cbs_VarDecLevel(Cbs_Man_t *, Gia_Obj_t *)");
      }
      uVar5 = uVar6 * 3;
      if ((int)uVar5 < 0) goto LAB_0071e37f;
      uVar2 = p->vLevReas->nSize;
      if (uVar2 == uVar5 || SBORROW4(uVar2,uVar5) != (int)(uVar2 + uVar6 * -3) < 0)
      goto LAB_0071e37f;
      piVar4 = p->vLevReas->pArray;
      iVar12 = piVar4[uVar5];
      if (iVar12 < Level) {
        ppGVar8 = (p->pClauses).pData;
        iVar12 = (int)local_48;
        local_48 = (ulong)(iVar12 + 1);
      }
      else {
        if (iVar12 != Level) {
          __assert_fail("iLitLevel == Level",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x279,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
        }
        if (uVar2 <= uVar5 + 1) goto LAB_0071e37f;
        lVar13 = (long)piVar4[uVar5 + 1];
        if (lVar13 == 0) {
          ppGVar8 = (p->pClauses).pData;
          iVar12 = (p->pClauses).iHead;
          goto LAB_0071e30e;
        }
        pGVar1 = pGVar11 + lVar13;
        if (((ulong)pGVar1 & 1) != 0) goto LAB_0071e3bd;
        iVar3 = (p->pClauses).iTail;
        if (iVar3 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar3 * 2;
          ppGVar8 = (p->pClauses).pData;
          sVar10 = (long)iVar3 << 4;
          if (ppGVar8 == (Gia_Obj_t **)0x0) {
            ppGVar8 = (Gia_Obj_t **)malloc(sVar10);
            (p->pClauses).pData = ppGVar8;
            goto LAB_0071e27f;
          }
          ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar10);
          iVar3 = (p->pClauses).iTail;
          uVar6 = pGVar11->Value;
          (p->pClauses).pData = ppGVar8;
          iVar12 = iVar3 + 1;
          (p->pClauses).iTail = iVar12;
          ppGVar8[iVar3] = pGVar1;
          if (uVar6 == 0xffffffff) {
            __assert_fail("pVar->Value != ~0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                          ,0x65,"Gia_Obj_t *Cbs_VarReason1(Cbs_Man_t *, Gia_Obj_t *)");
          }
        }
        else {
          ppGVar8 = (p->pClauses).pData;
LAB_0071e27f:
          iVar12 = iVar3 + 1;
          (p->pClauses).iTail = iVar12;
          ppGVar8[iVar3] = pGVar1;
        }
        uVar6 = uVar6 * 3 + 2;
        if (((int)uVar6 < 0) || (p->vLevReas->nSize <= (int)uVar6)) {
LAB_0071e37f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        lVar13 = (long)p->vLevReas->pArray[uVar6];
        if (lVar13 == 0) goto LAB_0071e315;
        pGVar11 = pGVar11 + lVar13;
        if (((ulong)pGVar11 & 1) != 0) {
LAB_0071e3bd:
          __assert_fail("!Gia_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                        ,0x120,"void Cbs_QuePush(Cbs_Que_t *, Gia_Obj_t *)");
        }
        if (iVar12 == (p->pClauses).nSize) {
          (p->pClauses).nSize = iVar12 * 2;
          ppGVar8 = (p->pClauses).pData;
          sVar10 = (long)(iVar12 * 2) << 3;
          if (ppGVar8 == (Gia_Obj_t **)0x0) {
            ppGVar8 = (Gia_Obj_t **)malloc(sVar10);
          }
          else {
            ppGVar8 = (Gia_Obj_t **)realloc(ppGVar8,sVar10);
            iVar12 = (p->pClauses).iTail;
          }
          (p->pClauses).pData = ppGVar8;
        }
        else {
          ppGVar8 = (p->pClauses).pData;
        }
        (p->pClauses).iTail = iVar12 + 1;
      }
LAB_0071e30e:
      ppGVar8[iVar12] = pGVar11;
    }
LAB_0071e315:
    uVar14 = uVar14 + 1;
    if ((long)(p->pClauses).iTail <= (long)uVar14) {
      if ((p->pClauses).pData[(p->pClauses).iHead] != (Gia_Obj_t *)0x0) {
        (p->pClauses).iTail = (int)local_48;
        pVVar9 = p->vTemp;
        if (0 < pVVar9->nSize) {
          lVar13 = 0;
          do {
            *(ulong *)pVVar9->pArray[lVar13] = *pVVar9->pArray[lVar13] | 0x40000000;
            lVar13 = lVar13 + 1;
            pVVar9 = p->vTemp;
          } while (lVar13 < pVVar9->nSize);
        }
        return;
      }
      __assert_fail("pQue->pData[pQue->iHead] != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                    ,0x286,"void Cbs_ManDeriveReason(Cbs_Man_t *, int)");
    }
  } while( true );
}

Assistant:

static inline void Cbs_ManDeriveReason( Cbs_Man_t * p, int Level )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    Gia_Obj_t * pObj, * pReason;
    int i, k, iLitLevel;
    assert( pQue->pData[pQue->iHead] == NULL );
    assert( pQue->iHead + 1 < pQue->iTail );
/*
    for ( i = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        assert( pObj->fMark0 == 1 );
    }
*/
    // compact literals
    Vec_PtrClear( p->vTemp );
    for ( i = k = pQue->iHead + 1; i < pQue->iTail; i++ )
    {
        pObj = pQue->pData[i];
        if ( !pObj->fMark0 ) // unassigned - seen again
            continue;
        // assigned - seen first time
        pObj->fMark0 = 0;
        Vec_PtrPush( p->vTemp, pObj );
        // check decision level
        iLitLevel = Cbs_VarDecLevel( p, pObj );
        if ( iLitLevel < Level )
        {
            pQue->pData[k++] = pObj;
            continue;
        }
        assert( iLitLevel == Level );
        pReason = Cbs_VarReason0( p, pObj );
        if ( pReason == pObj ) // no reason
        {
            //assert( pQue->pData[pQue->iHead] == NULL );
            pQue->pData[pQue->iHead] = pObj;
            continue;
        }
        Cbs_QuePush( pQue, pReason );
        pReason = Cbs_VarReason1( p, pObj );
        if ( pReason != pObj ) // second reason
            Cbs_QuePush( pQue, pReason );
    }
    assert( pQue->pData[pQue->iHead] != NULL );
    pQue->iTail = k;
    // clear the marks
    Vec_PtrForEachEntry( Gia_Obj_t *, p->vTemp, pObj, i )
        pObj->fMark0 = 1;
}